

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::StringStream<4096UL,_4096UL>::append
          (StringStream<4096UL,_4096UL> *this,char *s,size_t len)

{
  char *pcVar1;
  CompilerError *this_00;
  size_t local_78;
  allocator local_51;
  string local_50 [32];
  size_t local_30;
  size_t target_size;
  size_t avail;
  size_t len_local;
  char *s_local;
  StringStream<4096UL,_4096UL> *this_local;
  
  target_size = (this->current_buffer).size - (this->current_buffer).offset;
  avail = len;
  len_local = (size_t)s;
  s_local = (char *)this;
  if (target_size < len) {
    if (target_size != 0) {
      memcpy((this->current_buffer).buffer + (this->current_buffer).offset,s,target_size);
      len_local = target_size + len_local;
      avail = avail - target_size;
      (this->current_buffer).offset = target_size + (this->current_buffer).offset;
    }
    SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL>::push_back
              (&this->saved_buffers,&this->current_buffer);
    if (avail < 0x1001) {
      local_78 = 0x1000;
    }
    else {
      local_78 = avail;
    }
    local_30 = local_78;
    pcVar1 = (char *)malloc(local_78);
    (this->current_buffer).buffer = pcVar1;
    if ((this->current_buffer).buffer == (char *)0x0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_50,"Out of memory.",&local_51);
      CompilerError::CompilerError(this_00,(string *)local_50);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    memcpy((this->current_buffer).buffer,(void *)len_local,avail);
    (this->current_buffer).offset = avail;
    (this->current_buffer).size = local_30;
  }
  else {
    memcpy((this->current_buffer).buffer + (this->current_buffer).offset,s,len);
    (this->current_buffer).offset = avail + (this->current_buffer).offset;
  }
  return;
}

Assistant:

void append(const char *s, size_t len)
	{
		size_t avail = current_buffer.size - current_buffer.offset;
		if (avail < len)
		{
			if (avail > 0)
			{
				memcpy(current_buffer.buffer + current_buffer.offset, s, avail);
				s += avail;
				len -= avail;
				current_buffer.offset += avail;
			}

			saved_buffers.push_back(current_buffer);
			size_t target_size = len > BlockSize ? len : BlockSize;
			current_buffer.buffer = static_cast<char *>(malloc(target_size));
			if (!current_buffer.buffer)
				SPIRV_CROSS_THROW("Out of memory.");

			memcpy(current_buffer.buffer, s, len);
			current_buffer.offset = len;
			current_buffer.size = target_size;
		}
		else
		{
			memcpy(current_buffer.buffer + current_buffer.offset, s, len);
			current_buffer.offset += len;
		}
	}